

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LDSketch.cpp
# Opt level: O0

void LDSketch_destroy(LDSketch_t *sk)

{
  undefined8 *in_RDI;
  int i;
  undefined4 in_stack_fffffffffffffff0;
  int iVar1;
  
  for (iVar1 = 0; iVar1 < *(int *)(in_RDI + 1) * *(int *)((long)in_RDI + 0xc); iVar1 = iVar1 + 1) {
    dyn_tbl_destroy((dyn_tbl_t *)CONCAT44(iVar1,in_stack_fffffffffffffff0));
  }
  free((void *)*in_RDI);
  free(in_RDI);
  return;
}

Assistant:

void LDSketch_destroy(LDSketch_t* sk) {
	// free(LDSketch->T);
	for (int i = 0; i < sk->h * sk->w; ++i) {
		dyn_tbl_destroy(sk->tbl[i]);
	}
	free(sk->tbl);
	free(sk);
}